

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O1

Point webrtc::CrossProduct(Point *a,Point *b)

{
  Point PVar1;
  
  PVar1.c[0] = a->c[1] * b->c[2] - b->c[1] * a->c[2];
  PVar1.c[1] = a->c[2] * b->c[0] - b->c[2] * a->c[0];
  PVar1.c[2] = a->c[0] * b->c[1] - b->c[0] * a->c[1];
  return (Point)PVar1.c;
}

Assistant:

T y() const { return c[1]; }